

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtil.cpp
# Opt level: O0

size_t opencollada::String::Replace(string *str,char a,char b)

{
  undefined1 *puVar1;
  undefined1 in_DL;
  char in_SIL;
  ulong in_RDI;
  size_type pos;
  size_t count;
  undefined8 local_20;
  undefined8 local_18;
  
  local_18 = 0;
  local_20 = ::std::__cxx11::string::find((char)in_RDI,(ulong)(uint)(int)in_SIL);
  while (local_20 != -1) {
    puVar1 = (undefined1 *)::std::__cxx11::string::operator[](in_RDI);
    *puVar1 = in_DL;
    local_18 = local_18 + 1;
    local_20 = ::std::__cxx11::string::find((char)in_RDI,(ulong)(uint)(int)in_SIL);
  }
  return local_18;
}

Assistant:

size_t String::Replace(string & str, char a, char b)
	{
		size_t count = 0;
		for (auto pos = str.find(a); pos != string::npos; pos = str.find(a, pos + 1))
		{
			str[pos] = b;
			++count;
		}
		return count;
	}